

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Facet.hpp
# Opt level: O3

bool planeBoxOverlap(Point<double> *normal,Point<double> *vert,Point<double> *maxbox)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int q;
  long lVar4;
  ulong uVar5;
  double dVar6;
  Point<double> vmax;
  Point<double> vmin;
  
  lVar4 = 0;
  do {
    dVar1 = (normal->pos)._M_elems[lVar4];
    dVar2 = (maxbox->pos)._M_elems[lVar4];
    dVar6 = dVar2;
    if (dVar1 <= 0.0) {
      dVar6 = -dVar2;
    }
    dVar3 = (vert->pos)._M_elems[lVar4];
    uVar5 = -(ulong)(0.0 < dVar1);
    vmin.pos._M_elems[lVar4] = (double)(~uVar5 & (ulong)dVar2 | (ulong)-dVar2 & uVar5) - dVar3;
    vmax.pos._M_elems[lVar4] = dVar6 - dVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  dVar1 = (normal->pos)._M_elems[0];
  dVar2 = (normal->pos)._M_elems[1];
  dVar6 = (normal->pos)._M_elems[2];
  if (0.0 < vmin.pos._M_elems[2] * dVar6 +
            vmin.pos._M_elems[0] * dVar1 + vmin.pos._M_elems[1] * dVar2 + -1e-10) {
    return false;
  }
  return 0.0 <= dVar6 * vmax.pos._M_elems[2] +
                dVar1 * vmax.pos._M_elems[0] + dVar2 * vmax.pos._M_elems[1] + 1e-10;
}

Assistant:

inline bool planeBoxOverlap(const Parfait::Point<double> &normal, const Parfait::Point<double> &vert,
                     const Parfait::Point<double> &maxbox) {
    Parfait::Point<double> vmin, vmax;
    for (int q = 0; q < 3; q++) {
        double v = vert[q];
        if (normal[q] > 0.0) { vmin[q] = -maxbox[q] - v;
            vmax[q] = maxbox[q] - v;
        } else {
            vmin[q] = maxbox[q] - v;
            vmax[q] = -maxbox[q] - v;
        }
    }
    if (Parfait::Point<double>::dot(normal, vmin) - TOL > 0.0) {
        return false;
    }
    if (Parfait::Point<double>::dot(normal, vmax) + TOL >= 0.0) {
        return true;
    }

    return false;
}